

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

Fad<double> * __thiscall Fad<double>::operator*=(Fad<double> *this,double *val)

{
  int iVar1;
  double *pdVar2;
  double *in_RSI;
  Fad<double> *in_RDI;
  int i;
  double *dxp;
  int sz;
  int local_24;
  
  in_RDI->val_ = *in_RSI * in_RDI->val_;
  iVar1 = Vector<double>::size((Vector<double> *)0x10b97e2);
  if (iVar1 != 0) {
    pdVar2 = Vector<double>::begin(&in_RDI->dx_);
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      pdVar2[local_24] = *in_RSI * pdVar2[local_24];
    }
  }
  return in_RDI;
}

Assistant:

inline  Fad<T> & Fad<T>::operator*= (const T& val)
{
  val_ *= val;

  int sz = dx_.size();
  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    for (int i=0; i<sz;++i)
      dxp[i] *= val;
  }

  return *this;
}